

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t
exr_attr_list_remove(exr_context_t ctxt,exr_attribute_list_t *list,exr_attribute_t *attr)

{
  exr_attribute_t **ppeVar1;
  exr_attribute_t *peVar2;
  exr_result_t eVar3;
  long lVar4;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (attr == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar5 = "NULL attribute passed to remove";
  }
  else if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar5 = "Invalid list pointer to remove attribute";
  }
  else {
    iVar7 = list->num_attributes;
    lVar4 = (long)iVar7;
    ppeVar1 = list->entries;
    iVar6 = -1;
    if (0 < lVar4) {
      lVar9 = 0;
      do {
        if (ppeVar1[lVar9] == attr) {
          iVar6 = (int)lVar9;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar4 != lVar9);
    }
    if (iVar6 != -1) {
      lVar9 = (long)iVar6;
      ppeVar1[lVar9] = (exr_attribute_t *)0x0;
      iVar8 = (int)(lVar4 + -1);
      if (iVar6 < iVar8) {
        do {
          ppeVar1[lVar9] = ppeVar1[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (lVar4 + -1 != lVar9);
      }
      list->num_attributes = iVar8;
      if (0 < iVar7) {
        ppeVar1 = list->sorted_entries;
        lVar9 = 0;
        iVar7 = 0;
        do {
          peVar2 = ppeVar1[lVar9];
          if (peVar2 != attr) {
            lVar10 = (long)iVar7;
            iVar7 = iVar7 + 1;
            ppeVar1[lVar10] = peVar2;
          }
          lVar9 = lVar9 + 1;
        } while (lVar4 != lVar9);
      }
      eVar3 = attr_destroy(ctxt,attr);
      return eVar3;
    }
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar5 = "Attribute not in list";
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar5);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_list_remove (
    exr_context_t ctxt, exr_attribute_list_t* list, exr_attribute_t* attr)
{
    int               cattrsz, attridx = -1;
    exr_attribute_t** attrs;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!attr)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "NULL attribute passed to remove");
    }

    if (!list)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to remove attribute");
    }

    cattrsz = list->num_attributes;
    attrs   = list->entries;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr)
        {
            attridx = i;
            break;
        }
    }

    if (attridx == -1)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Attribute not in list");
    }

    list->entries[attridx] = NULL;
    for (int i = attridx; i < (cattrsz - 1); ++i)
        attrs[i] = attrs[i + 1];
    list->num_attributes = cattrsz - 1;

    attrs   = list->sorted_entries;
    attridx = 0;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr) continue;
        attrs[attridx++] = attrs[i];
    }

    return attr_destroy (ctxt, attr);
}